

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

bool __thiscall
FOptionMenuScreenResolutionLine::SetValue(FOptionMenuScreenResolutionLine *this,int i,int v)

{
  if (i == 0x30004) {
    this->mHighlight = v;
  }
  else {
    if (i != 0x30003) {
      return false;
    }
    this->mSelection = v;
  }
  return true;
}

Assistant:

bool SetValue(int i, int v)
	{
		if (i == SRL_SELECTION)
		{
			mSelection = v;
			return true;
		}
		else if (i == SRL_HIGHLIGHT)
		{
			mHighlight = v;
			return true;
		}
		return false;
	}